

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

ps_lattice_t * ngram_search_lattice(ps_search_t *search)

{
  float32 lwf_00;
  int iVar1;
  ps_latnode_s *ppVar2;
  int32 iVar3;
  int iVar4;
  long lVar5;
  ps_lattice_t *dag_00;
  ps_latnode_t *ppVar6;
  bool bVar7;
  char *local_a8;
  char *local_90;
  ps_latnode_s *local_80;
  ps_latnode_t *alt;
  bptbl_t *from_bpe;
  int lef;
  int fef;
  ps_latnode_t *next;
  uint local_58;
  float lwf;
  int nlink;
  int min_endfr;
  ps_lattice_t *dag;
  ngram_search_t *ngs;
  ps_latnode_t *to;
  ps_latnode_t *from;
  ps_latnode_t *node;
  int32 lscr;
  int32 ascr;
  int32 score;
  int32 i;
  ps_search_t *search_local;
  
  _score = search;
  lVar5 = ps_config_int(search->config,"min_endfr");
  if ((*(int *)&search[3].last_link == -0x20000000) || (*(int *)&search[3].last_link < -0x20000000))
  {
    search_local = (ps_search_t *)0x0;
  }
  else if ((_score->dag == (ps_lattice_t *)0x0) ||
          (_score->dag->n_frames != *(int *)((long)&search[3].type + 4))) {
    ps_lattice_free(_score->dag);
    _score->dag = (ps_lattice_t *)0x0;
    dag_00 = ps_lattice_init_search(_score,*(int *)((long)&search[3].type + 4));
    if (*(char *)((long)&search[1].name + 1) == '\0') {
      lwf_00 = 1.0;
    }
    else {
      lwf_00 = *(float32 *)((long)&search[3].dag + 4);
    }
    create_dag_nodes((ngram_search_t *)search,dag_00);
    ppVar6 = find_start_node((ngram_search_t *)search,dag_00);
    dag_00->start = ppVar6;
    if (ppVar6 != (ps_latnode_t *)0x0) {
      ppVar6 = find_end_node((ngram_search_t *)search,dag_00,(float32)search[3].n_words);
      dag_00->end = ppVar6;
      if (ppVar6 != (ps_latnode_t *)0x0) {
        if (dag_00->start->wid < 0) {
          local_90 = (char *)0x0;
        }
        else {
          local_90 = _score->dict->word[dag_00->start->wid].word;
        }
        if (dag_00->end->wid < 0) {
          local_a8 = (char *)0x0;
        }
        else {
          local_a8 = _score->dict->word[dag_00->end->wid].word;
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x4df,"lattice start node %s.%d end node %s.%d\n",local_90,
                (ulong)(uint)dag_00->start->sf,local_a8,dag_00->end->sf);
        ngram_compute_seg_score
                  ((ngram_search_t *)search,
                   (bptbl_t *)(*(long *)&search[2].post + (long)dag_00->end->lef * 0x24),lwf_00,
                   &dag_00->final_node_ascr,(int32 *)&node);
        ascr = 0;
        while( true ) {
          bVar7 = false;
          if (dag_00->nodes != (ps_latnode_t *)0x0) {
            bVar7 = dag_00->nodes != dag_00->end;
          }
          if (!bVar7) break;
          ppVar2 = dag_00->nodes->next;
          __listelem_free__(dag_00->latnode_alloc,dag_00->nodes,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                            ,0x4f5);
          dag_00->nodes = ppVar2;
          ascr = ascr + 1;
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x4f9,"Eliminated %d nodes before end node\n",(ulong)(uint)ascr);
        dag_00->end->reachable = 1;
        local_58 = 0;
        for (ngs = (ngram_search_t *)dag_00->end; ngs != (ngram_search_t *)0x0;
            ngs = (ngram_search_t *)(ngs->base).hyp_str) {
          if (*(short *)&(ngs->base).pls != 0) {
            if ((ngs == (ngram_search_t *)dag_00->end) ||
               ((int)lVar5 <=
                *(int *)(*(long *)&search[2].post + (long)*(int *)&(ngs->base).name * 0x24) -
                *(int *)(*(long *)&search[2].post +
                        (long)*(int *)((long)&(ngs->base).type + 4) * 0x24))) {
              for (to = (ps_latnode_t *)(ngs->base).hyp_str; to != (ps_latnode_t *)0x0;
                  to = to->next) {
                iVar4 = *(int *)(*(long *)&search[2].post + (long)to->fef * 0x24);
                iVar1 = *(int *)(*(long *)&search[2].post + (long)to->lef * 0x24);
                if ((iVar4 < *(int *)((long)&(ngs->base).name + 4)) &&
                   (*(int *)((long)&(ngs->base).name + 4) <= iVar1 + 1)) {
                  if (iVar1 - iVar4 < (int)lVar5) {
                    if (to->reachable != 0) {
                      __assert_fail("!from->reachable",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                    ,0x516,"ps_lattice_t *ngram_search_lattice(ps_search_t *)");
                    }
                  }
                  else {
                    ascr = to->fef;
                    for (alt = (ps_latnode_t *)(*(long *)&search[2].post + (long)ascr * 0x24);
                        (ascr <= to->lef &&
                        ((alt->basewid != to->wid ||
                         (alt->id < *(int *)((long)&(ngs->base).name + 4) + -1))));
                        alt = (ps_latnode_t *)((long)&alt->info + 4)) {
                      ascr = ascr + 1;
                    }
                    if ((ascr <= to->lef) && (alt->id == *(int *)((long)&(ngs->base).name + 4) + -1)
                       ) {
                      ngram_compute_seg_score
                                ((ngram_search_t *)search,(bptbl_t *)alt,lwf_00,
                                 (int32 *)((long)&node + 4),(int32 *)&node);
                      iVar3 = ngram_search_exit_score
                                        ((ngram_search_t *)search,(bptbl_t *)alt,
                                         (int)*search->dict->word
                                               [*(int *)((long)&(ngs->base).vt + 4)].ciphone);
                      if (iVar3 == -0x20000000) {
                        lscr = -0x20000000;
                      }
                      else {
                        lscr = node._4_4_ + (iVar3 - alt->lef);
                        if (lscr < 1) {
                          if (-0x20000000 < lscr) {
                            ps_lattice_link(dag_00,to,(ps_latnode_t *)ngs,lscr,alt->id);
                            local_58 = local_58 + 1;
                            to->reachable = 1;
                          }
                        }
                        else {
                          ps_lattice_link(dag_00,to,(ps_latnode_t *)ngs,-0x67932,alt->id);
                          local_58 = local_58 + 1;
                          to->reachable = 1;
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              *(undefined2 *)&(ngs->base).pls = 0;
            }
          }
        }
        if (dag_00->start->reachable != 0) {
          for (from = dag_00->nodes; from != (ps_latnode_t *)0x0; from = from->next) {
            from->fef = *(int32 *)(*(long *)&search[2].post + (long)from->fef * 0x24);
            from->lef = *(int32 *)(*(long *)&search[2].post + (long)from->lef * 0x24);
            from->basewid = _score->dict->word[from->wid].basewid;
          }
          from = dag_00->nodes;
          do {
            if (from == (ps_latnode_t *)0x0) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x562,"Lattice has %d nodes, %d links\n",(ulong)(uint)dag_00->n_nodes,
                      (ulong)local_58);
              iVar4 = dict_filler_word(search->dict,dag_00->end->wid);
              if (iVar4 != 0) {
                dag_00->end->basewid = search->finish_wid;
              }
              ps_lattice_delete_unreachable(dag_00);
              ps_lattice_penalize_fillers
                        (dag_00,*(int32 *)&search[6].name,*(int32 *)((long)&search[6].type + 4));
              _score->dag = dag_00;
              return dag_00;
            }
            local_80 = from->next;
            while( true ) {
              bVar7 = false;
              if (local_80 != (ps_latnode_s *)0x0) {
                bVar7 = local_80->sf == from->sf;
              }
              if (!bVar7) goto LAB_00152359;
              if (local_80->basewid == from->basewid) break;
              local_80 = local_80->next;
            }
            local_80->alt = from->alt;
            from->alt = local_80;
LAB_00152359:
            from = from->next;
          } while( true );
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                ,0x54a,"End node of lattice isolated; unreachable\n");
      }
    }
    ps_lattice_free(dag_00);
    search_local = (ps_search_t *)0x0;
  }
  else {
    search_local = (ps_search_t *)_score->dag;
  }
  return (ps_lattice_t *)search_local;
}

Assistant:

ps_lattice_t *
ngram_search_lattice(ps_search_t *search)
{
    int32 i, score, ascr, lscr;
    ps_latnode_t *node, *from, *to;
    ngram_search_t *ngs;
    ps_lattice_t *dag;
    int min_endfr, nlink;
    float lwf;

    ngs = (ngram_search_t *)search;
    min_endfr = ps_config_int(ps_search_config(search), "min_endfr");

    /* If the best score is WORST_SCORE or worse, there is no way to
     * make a lattice. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return NULL;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == ngs->n_frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, ngs->n_frame);
    /* Compute these such that they agree with the fwdtree language weight. */
    lwf = ngs->fwdflat ? ngs->fwdflat_fwdtree_lw_ratio : 1.0;
    create_dag_nodes(ngs, dag);
    if ((dag->start = find_start_node(ngs, dag)) == NULL)
        goto error_out;
    if ((dag->end = find_end_node(ngs, dag, ngs->bestpath_fwdtree_lw_ratio)) == NULL)
        goto error_out;
    E_INFO("lattice start node %s.%d end node %s.%d\n",
           dict_wordstr(search->dict, dag->start->wid), dag->start->sf,
           dict_wordstr(search->dict, dag->end->wid), dag->end->sf);

    ngram_compute_seg_score(ngs, ngs->bp_table + dag->end->lef, lwf,
                            &dag->final_node_ascr, &lscr);

    /*
     * At this point, dag->nodes is ordered such that nodes earlier in
     * the list can follow (in time) those later in the list, but not
     * vice versa (see above - also note that adjacency is purely
     * determined by time which is why we can make this claim).  Now
     * create precedence links and simultanesously mark all nodes that
     * can reach dag->end.  (All nodes are reached from dag->start
     * simply by definition - they were created that way).
     *
     * Note that this also means that any nodes before dag->end in the
     * list can be discarded, meaning that dag->end will always be
     * equal to dag->nodes (FIXME: except when loading from a file but
     * we can fix that...)
     */
    i = 0;
    while (dag->nodes && dag->nodes != dag->end) {
        ps_latnode_t *next = dag->nodes->next;
        listelem_free(dag->latnode_alloc, dag->nodes);
        dag->nodes = next;
        ++i;
    }
    E_INFO("Eliminated %d nodes before end node\n", i);
    dag->end->reachable = TRUE;
    nlink = 0;
    for (to = dag->end; to; to = to->next) {
        int fef, lef;

        /* Skip if not reachable; it will never be reachable from dag->end */
        if (!to->reachable)
            continue;

        /* Prune nodes with too few endpoints - heuristic
           borrowed from Sphinx3 */
        fef = ngs->bp_table[to->fef].frame;
        lef = ngs->bp_table[to->lef].frame;
        if (to != dag->end && lef - fef < min_endfr) {
            to->reachable = FALSE;
            continue;
        }

        /* Find predecessors of to : from->fef+1 <= to->sf <= from->lef+1 */
        for (from = to->next; from; from = from->next) {
            bptbl_t *from_bpe;

            fef = ngs->bp_table[from->fef].frame;
            lef = ngs->bp_table[from->lef].frame;

            if ((to->sf <= fef) || (to->sf > lef + 1))
                continue;
            if (lef - fef < min_endfr) {
                assert(!from->reachable);
                continue;
            }

            /* Find bptable entry for "from" that exactly precedes "to" */
            i = from->fef;
            from_bpe = ngs->bp_table + i;
            for (; i <= from->lef; i++, from_bpe++) {
                if (from_bpe->wid != from->wid)
                    continue;
                if (from_bpe->frame >= to->sf - 1)
                    break;
            }

            if ((i > from->lef) || (from_bpe->frame != to->sf - 1))
                continue;

            /* Find acoustic score from.sf->to.sf-1 with right context = to */
            /* This gives us from_bpe's best acoustic score. */
            ngram_compute_seg_score(ngs, from_bpe, lwf,
                                    &ascr, &lscr);
            /* Now find the exact path score for from->to, including
             * the appropriate final triphone.  In fact this might not
             * exist. */
            score = ngram_search_exit_score(ngs, from_bpe,
                                            dict_first_phone(ps_search_dict(ngs), to->wid));
            /* Does not exist.  Can't create a link here. */
            if (score == WORST_SCORE)
                continue;
            /* Adjust the arc score to match the correct triphone. */
            else
                score = ascr + (score - from_bpe->score);
            if (score BETTER_THAN 0) {
                /* Scores must be negative, or Bad Things will happen.
                   In general, they are, except in corner cases
                   involving filler words.  We don't want to throw any
                   links away so we'll keep these, but with some
                   arbitrarily improbable but recognizable score. */
                ps_lattice_link(dag, from, to, -424242, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
            else if (score BETTER_THAN WORST_SCORE) {
                ps_lattice_link(dag, from, to, score, from_bpe->frame);
                ++nlink;
                from->reachable = TRUE;
            }
        }
    }

    /* There must be at least one path between dag->start and dag->end */
    if (!dag->start->reachable) {
        E_ERROR("End node of lattice isolated; unreachable\n");
        goto error_out;
    }

    for (node = dag->nodes; node; node = node->next) {
        /* Change node->{fef,lef} from bptbl indices to frames. */
        node->fef = ngs->bp_table[node->fef].frame;
        node->lef = ngs->bp_table[node->lef].frame;
        /* Find base wid for nodes. */
        node->basewid = dict_basewid(search->dict, node->wid);
    }

    /* Link nodes with alternate pronunciations at the same timepoint. */
    for (node = dag->nodes; node; node = node->next) {
        ps_latnode_t *alt;
        /* Scan forward to find the next alternate, then stop. */
        for (alt = node->next; alt && alt->sf == node->sf; alt = alt->next) {
            if (alt->basewid == node->basewid) {
                alt->alt = node->alt;
                node->alt = alt;
                break;
            }
        }
    }
    E_INFO("Lattice has %d nodes, %d links\n", dag->n_nodes, nlink);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(ps_search_dict(ngs), dag->end->wid))
        dag->end->basewid = ps_search_finish_wid(ngs);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    /* Add silprob and fillprob to corresponding links */
    ps_lattice_penalize_fillers(dag, ngs->silpen, ngs->fillpen);

    search->dag = dag;
    return dag;

error_out:
    ps_lattice_free(dag);
    return NULL;
}